

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O3

void __thiscall
QMimeMagicRule::QMimeMagicRule
          (QMimeMagicRule *this,QString *type,QByteArray *value,QString *offsets,QByteArray *mask,
          QString *errorString)

{
  QByteArray *this_00;
  QByteArray *this_01;
  Type *this_02;
  ArrayOptions *pAVar1;
  byte bVar2;
  uint uVar3;
  char16_t *pcVar4;
  QString *pQVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  undefined3 uVar8;
  bool bVar9;
  ushort uVar10;
  Type TVar11;
  CutResult CVar12;
  uint uVar13;
  uint uVar14;
  Data *pDVar15;
  byte *pbVar16;
  code *pcVar17;
  Data *pDVar18;
  long lVar19;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong __length;
  ulong extraout_RDX_01;
  char16_t *pcVar21;
  char *pcVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  char cVar26;
  int iVar27;
  ulong uVar28;
  char16_t *pcVar29;
  char *pcVar30;
  QArrayData *pQVar31;
  Data *pDVar32;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QStringView n;
  QStringView n_00;
  QByteArrayView haystack;
  bool ok;
  QString local_a8;
  QString local_88;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> local_68;
  long local_38;
  undefined7 uVar20;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_subMatches).d.d = (Data *)0x0;
  (this->m_subMatches).d.ptr = (QMimeMagicRule *)0x0;
  (this->m_subMatches).d.size = 0;
  QString::toLatin1_helper((QByteArray *)&local_68,type);
  TVar11 = QMimeMagicRule::type((QByteArray *)&local_68);
  if ((QArrayData *)local_68.a.a.m_size != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,1,0x10);
    }
  }
  this->m_type = TVar11;
  pDVar18 = (value->d).d;
  (this->m_value).d.d = pDVar18;
  (this->m_value).d.ptr = (value->d).ptr;
  (this->m_value).d.size = (value->d).size;
  if (pDVar18 != (Data *)0x0) {
    LOCK();
    (pDVar18->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar18->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar18 = (mask->d).d;
  (this->m_mask).d.d = pDVar18;
  (this->m_mask).d.ptr = (mask->d).ptr;
  (this->m_mask).d.size = (mask->d).size;
  if (pDVar18 != (Data *)0x0) {
    LOCK();
    (pDVar18->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar18->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = &this->m_mask;
  this_01 = &this->m_pattern;
  (this->m_pattern).d.d = (Data *)0x0;
  (this->m_pattern).d.ptr = (char *)0x0;
  (this->m_pattern).d.size = 0;
  this->m_matchFunction = 0;
  *(undefined8 *)&this->field_0x80 = 0;
  if (this->m_type == Invalid) {
    if (errorString == (QString *)0x0) goto switchD_004a6e5f_default;
    local_68.a.a.m_size = 5;
    local_68.a.a.m_data = "Type ";
    local_68.b.m_size = 0x11;
    local_68.b.m_data = " is not supported";
    local_68.a.b = type;
    QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>::
    convertTo<QString>(&local_88,&local_68);
LAB_004a7459:
    pQVar31 = &((errorString->d).d)->super_QArrayData;
    pcVar21 = (errorString->d).ptr;
    (errorString->d).d = local_88.d.d;
    (errorString->d).ptr = local_88.d.ptr;
    qVar6 = (errorString->d).size;
    (errorString->d).size = local_88.d.size;
    local_88.d.d = (Data *)pQVar31;
    local_88.d.ptr = pcVar21;
    local_88.d.size = qVar6;
    if (pQVar31 != (QArrayData *)0x0) {
      LOCK();
      (pQVar31->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar31->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar31->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar31,2,0x10);
      }
    }
    goto switchD_004a6e5f_default;
  }
  pDVar15 = (Data *)QString::indexOf(offsets,(QChar)0x3a,0,CaseSensitive);
  pcVar29 = (offsets->d).ptr;
  local_68.a.a.m_size = 0;
  local_88.d.d = pDVar15;
  CVar12 = QtPrivate::QContainerImplHelper::mid
                     ((offsets->d).size,(qsizetype *)&local_68,(qsizetype *)&local_88);
  pcVar21 = (char16_t *)0x0;
  pDVar32 = (Data *)0x0;
  if (CVar12 != Null) {
    pcVar21 = pcVar29 + local_68.a.a.m_size;
    pDVar32 = local_88.d.d;
  }
  pcVar4 = (offsets->d).ptr;
  local_68.a.a.m_size =
       (long)&(pDVar15->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
  local_88.d.d = (Data *)0xffffffffffffffff;
  CVar12 = QtPrivate::QContainerImplHelper::mid
                     ((offsets->d).size,(qsizetype *)&local_68,(qsizetype *)&local_88);
  pcVar29 = (char16_t *)0x0;
  pQVar31 = (QArrayData *)0x0;
  if (CVar12 != Null) {
    pcVar29 = pcVar4 + local_68.a.a.m_size;
    pQVar31 = &(local_88.d.d)->super_QArrayData;
  }
  n.m_data = pcVar21;
  n.m_size = (qsizetype)pDVar32;
  bVar9 = QMimeTypeParserBase::parseNumber(n,&this->m_startPos,errorString);
  this_02 = &this->m_type;
  if ((!bVar9) ||
     (n_00.m_data = pcVar29, n_00.m_size = (qsizetype)pQVar31,
     bVar9 = QMimeTypeParserBase::parseNumber(n_00,&this->m_endPos,errorString), !bVar9)) {
    *this_02 = Invalid;
    goto switchD_004a6e5f_default;
  }
  if ((this->m_value).d.size == 0) {
    QMimeMagicRule((QMimeMagicRule *)this_02);
    goto switchD_004a6e5f_default;
  }
  TVar11 = *this_02;
  if (TVar11 - Host16 < 7) {
    local_a8.d.d = (Data *)CONCAT71(local_a8.d.d._1_7_,0xaa);
    uVar13 = QByteArray::toUInt(&this->m_value,(bool *)&local_a8,0);
    this->m_number = uVar13;
    if ((char)local_a8.d.d == '\0') {
      *this_02 = Invalid;
      if (errorString == (QString *)0x0) goto switchD_004a6e5f_default;
      local_68.b.m_size = (qsizetype)(this->m_value).d.ptr;
      local_68.a.b = (QString *)(this->m_value).d.size;
      local_68.a.a.m_size = 0x1a;
      local_68.a.a.m_data = "Invalid magic rule value \"";
      local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
                (&local_88,
                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)&local_68
                );
      goto LAB_004a7459;
    }
    if ((this->m_mask).d.size == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = QByteArray::toUInt(this_00,(bool *)&local_a8,0);
    }
    this->m_numberMask = uVar13;
    TVar11 = this->m_type;
  }
  switch(TVar11) {
  case String:
    local_68.a.b = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.a.a.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_68,(this->m_value).d.size,Uninitialized);
    if (((Data *)local_68.a.a.m_size == (Data *)0x0) ||
       (__length = extraout_RDX,
       1 < (((QArrayData *)local_68.a.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((QByteArray *)&local_68,(qsizetype)local_68.a.b,KeepSize);
      __length = extraout_RDX_00;
    }
    pcVar22 = (this->m_value).d.ptr;
    lVar19 = (this->m_value).d.size;
    if ((byte *)pcVar22 == (byte *)0x0) {
      pcVar22 = &QByteArray::_empty;
    }
    pcVar30 = local_68.a.a.m_data;
    if (lVar19 != 0) {
      pbVar16 = (byte *)pcVar22 + lVar19;
      do {
        uVar20 = (undefined7)(__length >> 8);
        __length = CONCAT71(uVar20,*pcVar22);
        pbVar25 = (byte *)pcVar22;
        if (*pcVar22 == 0x5c) {
          pbVar25 = (byte *)pcVar22 + 1;
          bVar2 = ((byte *)pcVar22)[1];
          __length = CONCAT71(uVar20,bVar2);
          if (pbVar25 < pbVar16) {
            if (bVar2 == 0x78) {
              if ((byte *)pcVar22 + 2 < pbVar16) {
                bVar2 = 1;
                __length = 0;
                pbVar25 = (byte *)pcVar22 + 3;
                do {
                  pbVar23 = pbVar25;
                  iVar27 = (int)(char)pbVar23[-1];
                  uVar14 = iVar27 - 0x30;
                  if (9 < uVar14) {
                    if (iVar27 - 0x41U < 6) {
                      uVar14 = iVar27 - 0x37;
                    }
                    else {
                      uVar14 = iVar27 - 0x57;
                      if (5 < iVar27 - 0x61U) {
                        uVar14 = 0xffffffff;
                      }
                    }
                  }
                  uVar28 = __length & 0xff;
                  __length = (ulong)((int)uVar28 * 0x10 + uVar14);
                  if (uVar14 == 0xffffffff) {
                    __length = uVar28;
                  }
                  bVar9 = (bool)(bVar2 & pbVar23 < pbVar16);
                  bVar2 = 0;
                  pbVar25 = pbVar23 + 1;
                } while (bVar9);
                pbVar25 = pbVar23 + -1;
              }
              else {
                __length = 0;
              }
            }
            else if ((bVar2 & 0xf8) == 0x30) {
              uVar14 = (int)__length - 0x30;
              __length = (ulong)uVar14;
              pbVar23 = (byte *)pcVar22 + 2;
              if ((pbVar23 < pbVar16) && ((*pbVar23 & 0xf8) == 0x30)) {
                uVar8 = (undefined3)(uVar14 >> 8);
                cVar26 = (char)uVar14 * '\b' + *pbVar23 + -0x30;
                __length = (ulong)CONCAT31(uVar8,cVar26);
                pbVar24 = (byte *)pcVar22 + 3;
                pbVar25 = pbVar23;
                if ((pbVar24 < pbVar16) && (bVar2 < 0x34 && (*pbVar24 & 0xf8) == 0x30)) {
                  __length = (ulong)CONCAT31(uVar8,cVar26 * '\b' + *pbVar24 + -0x30);
                  pbVar25 = pbVar24;
                }
              }
            }
            else if (bVar2 == 0x6e) {
              __length = CONCAT71(uVar20,10);
            }
            else if (bVar2 == 0x74) {
              __length = CONCAT71(uVar20,9);
            }
            else if (bVar2 == 0x72) {
              __length = CONCAT71(uVar20,0xd);
            }
          }
        }
        *pcVar30 = (char)__length;
        pcVar30 = pcVar30 + 1;
        pcVar22 = (char *)(pbVar25 + 1);
      } while (pcVar22 < pbVar16);
    }
    if (((Data *)local_68.a.a.m_size == (Data *)0x0) ||
       (1 < (((QArrayData *)local_68.a.a.m_size)->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((QByteArray *)&local_68,(qsizetype)local_68.a.b,KeepSize);
      __length = extraout_RDX_01;
    }
    QByteArray::truncate((QByteArray *)&local_68,pcVar30 + -(long)local_68.a.a.m_data,__length);
    pQVar31 = &((this->m_pattern).d.d)->super_QArrayData;
    pcVar22 = (this->m_pattern).d.ptr;
    (this->m_pattern).d.d = (Data *)local_68.a.a.m_size;
    (this->m_pattern).d.ptr = local_68.a.a.m_data;
    pQVar5 = (QString *)(this->m_pattern).d.size;
    (this->m_pattern).d.size = (qsizetype)local_68.a.b;
    local_68.a.a.m_size = (qsizetype)pQVar31;
    local_68.a.a.m_data = pcVar22;
    local_68.a.b = pQVar5;
    if (pQVar31 != (QArrayData *)0x0) {
      LOCK();
      (pQVar31->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar31->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar31->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar31,1,0x10);
      }
    }
    pDVar18 = (this_01->d).d;
    if (pDVar18 != (Data *)0x0) {
      qVar6 = (this->m_pattern).d.size;
      if ((1 < (pDVar18->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar19 = (pDVar18->super_QArrayData).alloc, qVar6 < lVar19)) {
        QByteArray::reallocData(this_01,qVar6,KeepSize);
        pDVar18 = (this_01->d).d;
        if (pDVar18 == (Data *)0x0) goto LAB_004a71b9;
        lVar19 = (pDVar18->super_QArrayData).alloc;
      }
      if (lVar19 != 0) {
        pAVar1 = &(pDVar18->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
      }
    }
LAB_004a71b9:
    pQVar5 = (QString *)(this->m_mask).d.size;
    if (pQVar5 != (QString *)0x0) {
      if ((QString *)0x3 < pQVar5) {
        pcVar22 = (this->m_mask).d.ptr;
        needle.m_data = "0x";
        needle.m_size = 2;
        haystack.m_data = pcVar22;
        haystack.m_size = (qsizetype)pQVar5;
        bVar9 = QtPrivate::startsWith(haystack,needle);
        if (bVar9) {
          if (pcVar22 == (char *)0x0) {
            pcVar22 = &QByteArray::_empty;
          }
          local_68.a.a.m_data = pcVar22 + 2;
          local_68.a.b = (QString *)((long)&pQVar5[-1].d.size + 6);
          local_68.a.a.m_size = 0;
          QByteArray::fromHex((QByteArray *)&local_88,(QByteArray *)&local_68);
          if ((QArrayData *)local_68.a.a.m_size != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_68.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_68.a.a.m_size,1,0x10);
            }
          }
          qVar6 = local_88.d.size;
          lVar19 = (this->m_pattern).d.size;
          if (local_88.d.size == lVar19) {
            QByteArray::operator=(this_00,(QByteArray *)&local_88);
          }
          else {
            *this_02 = Invalid;
            if (errorString != (QString *)0x0) {
              local_68.b.m_size = (qsizetype)(this->m_mask).d.ptr;
              local_68.a.b = (QString *)(this->m_mask).d.size;
              local_68.a.a.m_size = 0x1e;
              local_68.a.a.m_data = "Invalid magic rule mask size \"";
              local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
              QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::
              convertTo<QString>(&local_a8,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>
                                  *)&local_68);
              pQVar31 = &((errorString->d).d)->super_QArrayData;
              pcVar21 = (errorString->d).ptr;
              (errorString->d).d = local_a8.d.d;
              (errorString->d).ptr = local_a8.d.ptr;
              qVar7 = (errorString->d).size;
              (errorString->d).size = local_a8.d.size;
              local_a8.d.d = (Data *)pQVar31;
              local_a8.d.ptr = pcVar21;
              local_a8.d.size = qVar7;
              if (pQVar31 != (QArrayData *)0x0) {
                LOCK();
                (pQVar31->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar31->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar31->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar31,2,0x10);
                }
              }
            }
          }
          if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (qVar6 != lVar19) goto switchD_004a6e5f_default;
          goto LAB_004a72dd;
        }
      }
      *this_02 = Invalid;
      if (errorString == (QString *)0x0) goto switchD_004a6e5f_default;
      local_68.b.m_size = (qsizetype)(this->m_mask).d.ptr;
      local_68.a.a.m_size = 0x19;
      local_68.a.a.m_data = "Invalid magic rule mask \"";
      local_68.b.m_data = (char *)CONCAT62(local_68.b.m_data._2_6_,0x22);
      local_68.a.b = pQVar5;
      QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t>::convertTo<QString>
                (&local_88,
                 (QStringBuilder<QStringBuilder<QLatin1String,_QLatin1String>,_char16_t> *)&local_68
                );
      goto LAB_004a7459;
    }
    QByteArray::fill(this_00,-1,(this->m_pattern).d.size);
LAB_004a72dd:
    pDVar18 = (this_00->d).d;
    if (pDVar18 != (Data *)0x0) {
      qVar6 = (this->m_mask).d.size;
      if ((1 < (pDVar18->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar19 = (pDVar18->super_QArrayData).alloc, qVar6 < lVar19)) {
        QByteArray::reallocData(this_00,qVar6,KeepSize);
        pDVar18 = (this_00->d).d;
        if (pDVar18 == (Data *)0x0) goto LAB_004a7327;
        lVar19 = (pDVar18->super_QArrayData).alloc;
      }
      if (lVar19 != 0) {
        pAVar1 = &(pDVar18->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i & 0xfe;
      }
    }
LAB_004a7327:
    pcVar17 = matchString;
    break;
  case Host16:
    if (0xffff < this->m_number) goto switchD_004a6e5f_default;
    goto LAB_004a72b4;
  case Host32:
    uVar14 = this->m_numberMask;
LAB_004a70d2:
    if (uVar14 == 0) goto LAB_004a70d6;
    goto LAB_004a70dd;
  case Big16:
  case Little16:
    if (0xffff < this->m_number) goto switchD_004a6e5f_default;
    if (TVar11 == Little16) {
      uVar14 = this->m_numberMask;
      if (uVar14 != 0) {
LAB_004a72af:
        this->m_numberMask = uVar14 & 0xffff;
      }
    }
    else {
      uVar10 = (ushort)this->m_number;
      this->m_number = (uint)(ushort)(uVar10 << 8 | uVar10 >> 8);
      if (this->m_numberMask != 0) {
        uVar10 = (ushort)this->m_numberMask;
        uVar14 = (uint)(ushort)(uVar10 << 8 | uVar10 >> 8);
        goto LAB_004a72af;
      }
    }
LAB_004a72b4:
    if (this->m_numberMask == 0) {
      this->m_numberMask = 0xffff;
    }
    pcVar17 = matchNumber<unsigned_short>;
    break;
  case Big32:
    uVar14 = this->m_number;
    uVar3 = this->m_numberMask;
    this->m_number =
         uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
    if (uVar3 != 0) {
      uVar14 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
LAB_004a70d0:
      this->m_numberMask = uVar14;
      goto LAB_004a70d2;
    }
    goto LAB_004a70d6;
  case Little32:
    uVar14 = this->m_numberMask;
    if (uVar14 != 0) goto LAB_004a70d0;
LAB_004a70d6:
    this->m_numberMask = 0xffffffff;
LAB_004a70dd:
    pcVar17 = matchNumber<unsigned_int>;
    break;
  case Byte:
    if (0xff < this->m_number) goto switchD_004a6e5f_default;
    if (this->m_numberMask == 0) {
      this->m_numberMask = 0xff;
    }
    pcVar17 = matchNumber<unsigned_char>;
    break;
  default:
    goto switchD_004a6e5f_default;
  }
  this->m_matchFunction = (MatchFunction)pcVar17;
  *(undefined8 *)&this->field_0x80 = 0;
switchD_004a6e5f_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QMimeMagicRule::QMimeMagicRule(const QString &type,
                               const QByteArray &value,
                               const QString &offsets,
                               const QByteArray &mask,
                               QString *errorString)
    : m_type(QMimeMagicRule::type(type.toLatin1())),
      m_value(value),
      m_mask(mask),
      m_matchFunction(nullptr)
{
    if (Q_UNLIKELY(m_type == Invalid)) {
        if (errorString)
            *errorString = "Type "_L1 + type + " is not supported"_L1;
        return;
    }

    // Parse for offset as "1" or "1:10"
    const qsizetype colonIndex = offsets.indexOf(u':');
    const QStringView startPosStr = QStringView{offsets}.mid(0, colonIndex); // \ These decay to returning 'offsets'
    const QStringView endPosStr   = QStringView{offsets}.mid(colonIndex + 1);// / unchanged when colonIndex == -1
    if (Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(startPosStr, &m_startPos, errorString)) ||
        Q_UNLIKELY(!QMimeTypeParserBase::parseNumber(endPosStr, &m_endPos, errorString))) {
        m_type = Invalid;
        return;
    }

    if (Q_UNLIKELY(m_value.isEmpty())) {
        m_type = Invalid;
        if (errorString)
            *errorString = QStringLiteral("Invalid empty magic rule value");
        return;
    }

    if (m_type >= Host16 && m_type <= Byte) {
        bool ok;
        m_number = m_value.toUInt(&ok, 0); // autodetect base
        if (Q_UNLIKELY(!ok)) {
            m_type = Invalid;
            if (errorString)
                *errorString = "Invalid magic rule value \""_L1 + QLatin1StringView(m_value) + u'"';
            return;
        }
        m_numberMask = !m_mask.isEmpty() ? m_mask.toUInt(&ok, 0) : 0; // autodetect base
    }

    switch (m_type) {
    case String:
        m_pattern = makePattern(m_value);
        m_pattern.squeeze();
        if (!m_mask.isEmpty()) {
            if (Q_UNLIKELY(m_mask.size() < 4 || !m_mask.startsWith("0x"))) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            const QByteArray &tempMask = QByteArray::fromHex(QByteArray::fromRawData(
                                                     m_mask.constData() + 2, m_mask.size() - 2));
            if (Q_UNLIKELY(tempMask.size() != m_pattern.size())) {
                m_type = Invalid;
                if (errorString)
                    *errorString = "Invalid magic rule mask size \""_L1 + QLatin1StringView(m_mask) + u'"';
                return;
            }
            m_mask = tempMask;
        } else {
            m_mask.fill(char(-1), m_pattern.size());
        }
        m_mask.squeeze();
        m_matchFunction = &QMimeMagicRule::matchString;
        break;
    case Byte:
        if (m_number <= quint8(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint8(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint8>;
        }
        break;
    case Big16:
    case Little16:
        if (m_number <= quint16(-1)) {
            m_number = m_type == Little16 ? qFromLittleEndian<quint16>(m_number) : qFromBigEndian<quint16>(m_number);
            if (m_numberMask != 0)
                m_numberMask = m_type == Little16 ? qFromLittleEndian<quint16>(m_numberMask) : qFromBigEndian<quint16>(m_numberMask);
        }
        Q_FALLTHROUGH();
    case Host16:
        if (m_number <= quint16(-1)) {
            if (m_numberMask == 0)
                m_numberMask = quint16(-1);
            m_matchFunction = &QMimeMagicRule::matchNumber<quint16>;
        }
        break;
    case Big32:
    case Little32:
        m_number = m_type == Little32 ? qFromLittleEndian<quint32>(m_number) : qFromBigEndian<quint32>(m_number);
        if (m_numberMask != 0)
            m_numberMask = m_type == Little32 ? qFromLittleEndian<quint32>(m_numberMask) : qFromBigEndian<quint32>(m_numberMask);
        Q_FALLTHROUGH();
    case Host32:
        if (m_numberMask == 0)
            m_numberMask = quint32(-1);
        m_matchFunction = &QMimeMagicRule::matchNumber<quint32>;
        break;
    default:
        break;
    }
}